

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_affixutils.cpp
# Opt level: O3

UnicodeString *
icu_63::number::impl::AffixUtils::escape(UnicodeString *__return_storage_ptr__,UnicodeString *input)

{
  short sVar1;
  bool bVar2;
  uint srcChar;
  int iVar3;
  int32_t offset;
  UChar local_42;
  char16_t *local_40;
  
  (__return_storage_ptr__->super_Replaceable).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnicodeString_003f5be0;
  (__return_storage_ptr__->fUnion).fStackFields.fLengthAndFlags = 2;
  sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar3 = (input->fUnion).fFields.fLength;
  }
  else {
    iVar3 = (int)sVar1 >> 5;
  }
  if (0 < iVar3) {
    bVar2 = false;
    offset = 0;
    do {
      srcChar = UnicodeString::char32At(input,offset);
      switch(srcChar) {
      case 0x26:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2c:
switchD_00264a0b_caseD_26:
        if (bVar2) {
          local_42 = L'\'';
          UnicodeString::doAppend(__return_storage_ptr__,&local_42,0,1);
          bVar2 = false;
          UnicodeString::append(__return_storage_ptr__,srcChar);
          break;
        }
        goto LAB_00264a47;
      case 0x27:
        UnicodeString::doAppend(__return_storage_ptr__,L"\'\'",0,-1);
        local_40 = L"\'\'";
        break;
      default:
        if ((srcChar != 0xa4) && (srcChar != 0x2030)) goto switchD_00264a0b_caseD_26;
      case 0x25:
      case 0x2b:
      case 0x2d:
        if (bVar2) {
LAB_00264a47:
          UnicodeString::append(__return_storage_ptr__,srcChar);
        }
        else {
          local_42 = L'\'';
          UnicodeString::doAppend(__return_storage_ptr__,&local_42,0,1);
          bVar2 = true;
          UnicodeString::append(__return_storage_ptr__,srcChar);
        }
      }
      sVar1 = (input->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar3 = (input->fUnion).fFields.fLength;
      }
      else {
        iVar3 = (int)sVar1 >> 5;
      }
      offset = (offset - (uint)(srcChar < 0x10000)) + 2;
    } while (offset < iVar3);
    if (bVar2) {
      local_42 = L'\'';
      UnicodeString::doAppend(__return_storage_ptr__,&local_42,0,1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

UnicodeString AffixUtils::escape(const UnicodeString &input) {
    AffixPatternState state = STATE_BASE;
    int32_t offset = 0;
    UnicodeString output;
    for (; offset < input.length();) {
        UChar32 cp = input.char32At(offset);

        switch (cp) {
            case u'\'':
                output.append(u"''", -1);
                break;

            case u'-':
            case u'+':
            case u'%':
            case u'‰':
            case u'¤':
                if (state == STATE_BASE) {
                    output.append(u'\'');
                    output.append(cp);
                    state = STATE_INSIDE_QUOTE;
                } else {
                    output.append(cp);
                }
                break;

            default:
                if (state == STATE_INSIDE_QUOTE) {
                    output.append(u'\'');
                    output.append(cp);
                    state = STATE_BASE;
                } else {
                    output.append(cp);
                }
                break;
        }
        offset += U16_LENGTH(cp);
    }

    if (state == STATE_INSIDE_QUOTE) {
        output.append(u'\'');
    }

    return output;
}